

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O1

void __thiscall Highs::clearZeroHessian(Highs *this)

{
  HighsHessian *this_00;
  HighsInt HVar1;
  
  if ((this->model_).hessian_.dim_ != 0) {
    this_00 = &(this->model_).hessian_;
    HVar1 = HighsHessian::numNz(this_00);
    if (HVar1 == 0) {
      highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kInfo,
                   "Hessian has dimension %d but no nonzeros, so is ignored\n",
                   (ulong)(uint)(this->model_).hessian_.dim_);
      HighsHessian::clear(this_00);
      return;
    }
  }
  return;
}

Assistant:

void Highs::clearZeroHessian() {
  HighsHessian& hessian = model_.hessian_;
  if (hessian.dim_) {
    // Clear any zero Hessian
    if (hessian.numNz() == 0) {
      highsLogUser(options_.log_options, HighsLogType::kInfo,
                   "Hessian has dimension %" HIGHSINT_FORMAT
                   " but no nonzeros, so is ignored\n",
                   hessian.dim_);
      hessian.clear();
    }
  }
}